

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O3

int main(int argc,char **argv)

{
  undefined8 uVar1;
  FILE *__stream;
  size_t sVar2;
  undefined8 uVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 *__arg;
  int i;
  undefined4 in_register_0000003c;
  char *__s;
  pthread_t *__newthread;
  int i_1;
  pthread_t local_a8 [9];
  undefined8 uStack_60;
  wasm_byte_t awStack_58 [8];
  undefined1 local_50 [8];
  wasm_byte_vec_t binary;
  
  uStack_60 = 0x10260f;
  uVar1 = wasm_engine_new(CONCAT44(in_register_0000003c,argc));
  uStack_60 = 0x102625;
  __stream = fopen("threads.wasm","r");
  if (__stream != (FILE *)0x0) {
    uStack_60 = 0x102640;
    fseek(__stream,0,2);
    uStack_60 = 0x102648;
    sVar2 = ftell(__stream);
    uStack_60 = 0x102657;
    fseek(__stream,0,0);
    uStack_60 = 0x102666;
    wasm_byte_vec_new_uninitialized(local_50,sVar2);
    uStack_60 = 0x10267a;
    sVar2 = fread((void *)binary.size,sVar2,1,__stream);
    if (sVar2 == 1) {
      uStack_60 = 0x10268c;
      fclose(__stream);
      uStack_60 = 0x102694;
      uVar3 = wasm_store_new(uVar1);
      uStack_60 = 0x1026a3;
      lVar4 = wasm_module_new(uVar3,local_50);
      if (lVar4 != 0) {
        uStack_60 = 0x1026b8;
        wasm_byte_vec_delete(local_50);
        uStack_60 = 0x1026c0;
        uVar5 = wasm_module_share(lVar4);
        uStack_60 = 0x1026cb;
        wasm_module_delete(lVar4);
        uStack_60 = 0x1026d3;
        wasm_store_delete(uVar3);
        lVar4 = 0;
        __newthread = local_a8;
        binary.data = awStack_58;
        do {
          __arg = (undefined8 *)malloc(0x18);
          *(int *)(__arg + 2) = (int)lVar4;
          *__arg = uVar1;
          __arg[1] = uVar5;
          printf("Initializing thread %d...\n");
          pthread_create(__newthread,(pthread_attr_t *)0x0,run,__arg);
          lVar4 = lVar4 + 1;
          __newthread = __newthread + 1;
        } while (lVar4 != 10);
        lVar4 = 0;
        do {
          printf("Waiting for thread: %d\n");
          pthread_join(local_a8[lVar4],(void **)0x0);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 10);
        wasm_shared_module_delete(uVar5);
        wasm_engine_delete(uVar1);
        return 0;
      }
      __s = "> Error compiling module!";
      goto LAB_00102780;
    }
  }
  __s = "> Error loading module!";
LAB_00102780:
  uStack_60 = 0x102785;
  puts(__s);
  return 1;
}

Assistant:

int main(int argc, const char *argv[]) {
  // Initialize.
  wasm_engine_t* engine = wasm_engine_new();

  // Load binary.
  FILE* file = fopen("threads.wasm", "r");
  if (!file) {
    printf("> Error loading module!\n");
    return 1;
  }
  fseek(file, 0L, SEEK_END);
  size_t file_size = ftell(file);
  fseek(file, 0L, SEEK_SET);
  wasm_byte_vec_t binary;
  wasm_byte_vec_new_uninitialized(&binary, file_size);
  if (fread(binary.data, file_size, 1, file) != 1) {
    printf("> Error loading module!\n");
    return 1;
  }
  fclose(file);

  // Compile and share.
  own wasm_store_t* store = wasm_store_new(engine);
  own wasm_module_t* module = wasm_module_new(store, &binary);
  if (!module) {
    printf("> Error compiling module!\n");
    return 1;
  }

  wasm_byte_vec_delete(&binary);

  own wasm_shared_module_t* shared = wasm_module_share(module);

  wasm_module_delete(module);
  wasm_store_delete(store);

  // Spawn threads.
  pthread_t threads[N_THREADS];
  for (int i = 0; i < N_THREADS; i++) {
    thread_args* args = malloc(sizeof(thread_args));
    args->id = i;
    args->engine = engine;
    args->module = shared;
    printf("Initializing thread %d...\n", i);
    pthread_create(&threads[i], NULL, &run, args);
  }

  for (int i = 0; i < N_THREADS; i++) {
    printf("Waiting for thread: %d\n", i);
    pthread_join(threads[i], NULL);
  }

  wasm_shared_module_delete(shared);
  wasm_engine_delete(engine);

  return 0;
}